

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void AddSingleLiteralWithCostModel
               (uint32_t *argb,VP8LColorCache *hashers,CostModel *cost_model,int idx,
               int use_color_cache,float prev_cost,float *cost,uint16_t *dist_array)

{
  uint32_t v;
  uint32_t argb_00;
  int in_ECX;
  CostModel *in_RDX;
  long in_RDI;
  int in_R8D;
  long in_R9;
  float in_XMM0_Da;
  double mul1;
  double mul0;
  int ix;
  uint32_t color;
  double cost_val;
  uint32_t in_stack_ffffffffffffffac;
  VP8LColorCache *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  
  v = *(uint32_t *)(in_RDI + (long)in_ECX * 4);
  if (in_R8D == 0) {
    argb_00 = 0xffffffff;
  }
  else {
    argb_00 = VP8LColorCacheContains(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  if ((int)argb_00 < 0) {
    if (in_R8D != 0) {
      VP8LColorCacheInsert((VP8LColorCache *)0x3fea3d70a3d70a3d,argb_00);
    }
    local_38 = GetLiteralCost(in_RDX,v);
    local_38 = local_38 * 0.82;
  }
  else {
    local_38 = GetCacheCost(in_RDX,argb_00);
    local_38 = local_38 * 0.68;
  }
  local_38 = local_38 + (double)in_XMM0_Da;
  if (local_38 < (double)*(float *)(in_R9 + (long)in_ECX * 4)) {
    *(float *)(in_R9 + (long)in_ECX * 4) = (float)local_38;
    *(undefined2 *)((long)mul1 + (long)in_ECX * 2) = 1;
  }
  return;
}

Assistant:

static WEBP_INLINE void AddSingleLiteralWithCostModel(
    const uint32_t* const argb, VP8LColorCache* const hashers,
    const CostModel* const cost_model, int idx, int use_color_cache,
    float prev_cost, float* const cost, uint16_t* const dist_array) {
  double cost_val = prev_cost;
  const uint32_t color = argb[idx];
  const int ix = use_color_cache ? VP8LColorCacheContains(hashers, color) : -1;
  if (ix >= 0) {
    // use_color_cache is true and hashers contains color
    const double mul0 = 0.68;
    cost_val += GetCacheCost(cost_model, ix) * mul0;
  } else {
    const double mul1 = 0.82;
    if (use_color_cache) VP8LColorCacheInsert(hashers, color);
    cost_val += GetLiteralCost(cost_model, color) * mul1;
  }
  if (cost[idx] > cost_val) {
    cost[idx] = (float)cost_val;
    dist_array[idx] = 1;  // only one is inserted.
  }
}